

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

char16 * __thiscall Js::ConcatStringBuilder::GetSz(ConcatStringBuilder *this)

{
  char16 *pcVar1;
  ConcatStringBuilder *pCVar2;
  
  pcVar1 = ConcatStringBase::GetSzImpl<Js::ConcatStringBuilder>(&this->super_ConcatStringBase);
  pCVar2 = this;
  do {
    memset((pCVar2->m_slots).ptr,0,(long)pCVar2->m_count << 3);
    pCVar2 = (pCVar2->m_prevChunk).ptr;
  } while (pCVar2 != (ConcatStringBuilder *)0x0);
  (this->super_ConcatStringBase).super_LiteralString.super_JavascriptString.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::Address;
  Memory::Recycler::WBSetBit((char *)&this->m_slots);
  (this->m_slots).ptr = (WriteBarrierPtr<Js::JavascriptString> *)0x0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_slots);
  return pcVar1;
}

Assistant:

const char16 * ConcatStringBuilder::GetSz()
    {
        const char16 * sz = GetSzImpl<ConcatStringBuilder>();

        // Allow a/b to be garbage collected if no more refs.
        ConcatStringBuilder* current = this;
        while (current != NULL)
        {
            ClearArray(current->m_slots, current->m_count);
            current = current->m_prevChunk;
        }

        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return sz;
    }